

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_starttls(connectdata *conn)

{
  CURLcode CVar1;
  CURLcode result;
  connectdata *conn_local;
  
  CVar1 = imap_sendf(conn,"STARTTLS");
  if (CVar1 == CURLE_OK) {
    state(conn,IMAP_STARTTLS);
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_starttls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Send the STARTTLS command */
  result = imap_sendf(conn, "STARTTLS");

  if(!result)
    state(conn, IMAP_STARTTLS);

  return result;
}